

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void av1_read_color_config
               (aom_read_bit_buffer *rb,int allow_lowbitdepth,SequenceHeader *seq_params,
               aom_internal_error_info *error_info)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  aom_color_primaries_t aVar4;
  aom_transfer_characteristics_t aVar5;
  aom_matrix_coefficients_t aVar6;
  aom_chroma_sample_position_t aVar7;
  bool bVar8;
  
  iVar2 = aom_rb_read_bit(rb);
  bVar8 = iVar2 != 0;
  if (seq_params->profile == '\x02' && bVar8) {
    iVar2 = aom_rb_read_bit(rb);
    seq_params->bit_depth = (uint)(iVar2 != 0) * 2 + AOM_BITS_10;
    bVar8 = true;
  }
  else if (seq_params->profile < '\x03') {
    seq_params->bit_depth = (uint)(iVar2 != 0) * 2 + AOM_BITS_8;
  }
  else {
    aom_internal_error(error_info,AOM_CODEC_UNSUP_BITSTREAM,
                       "Unsupported profile/bit-depth combination");
    bVar8 = AOM_BITS_8 < seq_params->bit_depth;
  }
  seq_params->use_highbitdepth = allow_lowbitdepth == 0 | bVar8;
  iVar2 = 0;
  if (seq_params->profile != '\x01') {
    iVar2 = aom_rb_read_bit(rb);
  }
  seq_params->monochrome = (uint8_t)iVar2;
  iVar3 = aom_rb_read_bit(rb);
  if (iVar3 == 0) {
    seq_params->color_primaries = AOM_CICP_CP_UNSPECIFIED;
    seq_params->transfer_characteristics = AOM_CICP_TC_UNSPECIFIED;
    aVar6 = AOM_CICP_MC_UNSPECIFIED;
  }
  else {
    aVar4 = aom_rb_read_literal(rb,8);
    seq_params->color_primaries = aVar4;
    aVar5 = aom_rb_read_literal(rb,8);
    seq_params->transfer_characteristics = aVar5;
    aVar6 = aom_rb_read_literal(rb,8);
  }
  seq_params->matrix_coefficients = aVar6;
  if (iVar2 != 0) {
    iVar2 = aom_rb_read_bit(rb);
    seq_params->color_range = iVar2;
    seq_params->subsampling_x = 1;
    seq_params->subsampling_y = 1;
    seq_params->chroma_sample_position = AOM_CSP_UNKNOWN;
    uVar1 = '\0';
    goto LAB_009c1a35;
  }
  if ((seq_params->color_primaries == AOM_CICP_CP_BT_709) &&
     (seq_params->transfer_characteristics == AOM_CICP_TC_SRGB && aVar6 == AOM_CICP_MC_IDENTITY)) {
    seq_params->subsampling_y = 0;
    seq_params->color_range = 1;
    seq_params->subsampling_x = 0;
    if ((seq_params->profile != '\x01') &&
       ((seq_params->profile != '\x02' || (seq_params->bit_depth != AOM_BITS_12)))) {
      aom_internal_error(error_info,AOM_CODEC_UNSUP_BITSTREAM,
                         "sRGB colorspace not compatible with specified profile");
    }
  }
  else {
    iVar2 = aom_rb_read_bit(rb);
    seq_params->color_range = iVar2;
    if (seq_params->profile == '\x01') {
      seq_params->subsampling_x = 0;
      seq_params->subsampling_y = 0;
LAB_009c19e5:
      bVar8 = false;
    }
    else {
      if (seq_params->profile != '\0') {
        if (seq_params->bit_depth == AOM_BITS_12) {
          iVar2 = aom_rb_read_bit(rb);
          seq_params->subsampling_x = iVar2;
          if (iVar2 != 0) {
            iVar2 = aom_rb_read_bit(rb);
            seq_params->subsampling_y = iVar2;
            bVar8 = iVar2 != 0;
            goto LAB_009c19e7;
          }
          seq_params->subsampling_y = 0;
        }
        else {
          seq_params->subsampling_x = 1;
          seq_params->subsampling_y = 0;
        }
        goto LAB_009c19e5;
      }
      seq_params->subsampling_x = 1;
      seq_params->subsampling_y = 1;
      bVar8 = true;
    }
LAB_009c19e7:
    if ((seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY) &&
       (seq_params->subsampling_x != 0 || bVar8)) {
      aom_internal_error(error_info,AOM_CODEC_UNSUP_BITSTREAM,
                         "Identity CICP Matrix incompatible with non 4:4:4 color sampling");
    }
    if ((seq_params->subsampling_x != 0) && (seq_params->subsampling_y != 0)) {
      aVar7 = aom_rb_read_literal(rb,2);
      seq_params->chroma_sample_position = aVar7;
    }
  }
  iVar2 = aom_rb_read_bit(rb);
  uVar1 = (uint8_t)iVar2;
LAB_009c1a35:
  seq_params->separate_uv_delta_q = uVar1;
  return;
}

Assistant:

void av1_read_color_config(struct aom_read_bit_buffer *rb,
                           int allow_lowbitdepth, SequenceHeader *seq_params,
                           struct aom_internal_error_info *error_info) {
  read_bitdepth(rb, seq_params, error_info);

  seq_params->use_highbitdepth =
      seq_params->bit_depth > AOM_BITS_8 || !allow_lowbitdepth;
  // monochrome bit (not needed for PROFILE_1)
  const int is_monochrome =
      seq_params->profile != PROFILE_1 ? aom_rb_read_bit(rb) : 0;
  seq_params->monochrome = is_monochrome;
  int color_description_present_flag = aom_rb_read_bit(rb);
  if (color_description_present_flag) {
    seq_params->color_primaries = aom_rb_read_literal(rb, 8);
    seq_params->transfer_characteristics = aom_rb_read_literal(rb, 8);
    seq_params->matrix_coefficients = aom_rb_read_literal(rb, 8);
  } else {
    seq_params->color_primaries = AOM_CICP_CP_UNSPECIFIED;
    seq_params->transfer_characteristics = AOM_CICP_TC_UNSPECIFIED;
    seq_params->matrix_coefficients = AOM_CICP_MC_UNSPECIFIED;
  }
  if (is_monochrome) {
    // [16,235] (including xvycc) vs [0,255] range
    seq_params->color_range = aom_rb_read_bit(rb);
    seq_params->subsampling_y = seq_params->subsampling_x = 1;
    seq_params->chroma_sample_position = AOM_CSP_UNKNOWN;
    seq_params->separate_uv_delta_q = 0;
    return;
  }
  if (seq_params->color_primaries == AOM_CICP_CP_BT_709 &&
      seq_params->transfer_characteristics == AOM_CICP_TC_SRGB &&
      seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY) {
    seq_params->subsampling_y = seq_params->subsampling_x = 0;
    seq_params->color_range = 1;  // assume full color-range
    if (!(seq_params->profile == PROFILE_1 ||
          (seq_params->profile == PROFILE_2 &&
           seq_params->bit_depth == AOM_BITS_12))) {
      aom_internal_error(
          error_info, AOM_CODEC_UNSUP_BITSTREAM,
          "sRGB colorspace not compatible with specified profile");
    }
  } else {
    // [16,235] (including xvycc) vs [0,255] range
    seq_params->color_range = aom_rb_read_bit(rb);
    if (seq_params->profile == PROFILE_0) {
      // 420 only
      seq_params->subsampling_x = seq_params->subsampling_y = 1;
    } else if (seq_params->profile == PROFILE_1) {
      // 444 only
      seq_params->subsampling_x = seq_params->subsampling_y = 0;
    } else {
      assert(seq_params->profile == PROFILE_2);
      if (seq_params->bit_depth == AOM_BITS_12) {
        seq_params->subsampling_x = aom_rb_read_bit(rb);
        if (seq_params->subsampling_x)
          seq_params->subsampling_y = aom_rb_read_bit(rb);  // 422 or 420
        else
          seq_params->subsampling_y = 0;  // 444
      } else {
        // 422
        seq_params->subsampling_x = 1;
        seq_params->subsampling_y = 0;
      }
    }
    if (seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY &&
        (seq_params->subsampling_x || seq_params->subsampling_y)) {
      aom_internal_error(
          error_info, AOM_CODEC_UNSUP_BITSTREAM,
          "Identity CICP Matrix incompatible with non 4:4:4 color sampling");
    }
    if (seq_params->subsampling_x && seq_params->subsampling_y) {
      seq_params->chroma_sample_position = aom_rb_read_literal(rb, 2);
    }
  }
  seq_params->separate_uv_delta_q = aom_rb_read_bit(rb);
}